

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

bool __thiscall
wallet::CWallet::SetAddressBookWithDB
          (CWallet *this,WalletBatch *batch,CTxDestination *address,string *strName,
          optional<wallet::AddressPurpose> *new_purpose)

{
  AddressPurpose AVar1;
  pointer pcVar2;
  _Optional_payload_base<wallet::AddressPurpose> _Var3;
  bool bVar4;
  bool bVar5;
  isminetype iVar6;
  iterator iVar7;
  mapped_type *this_00;
  char *wallet_fmt;
  _Storage<wallet::AddressPurpose,_true> args_3;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock51;
  ChangeType local_bc;
  string local_98;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78._0_8_ = &this->cs_wallet;
  local_78[8] = false;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_78);
  iVar7 = std::
          _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>,_std::_Select1st<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
          ::find(&(this->m_address_book)._M_t,address);
  if ((_Rb_tree_header *)iVar7._M_node == &(this->m_address_book)._M_t._M_impl.super__Rb_tree_header
     ) {
    local_bc = CT_NEW;
    this_00 = std::
              map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
              ::operator[](&this->m_address_book,address);
  }
  else {
    local_bc = (ChangeType)*(byte *)&iVar7._M_node[4]._M_left;
    this_00 = (mapped_type *)&iVar7._M_node[3]._M_left;
  }
  pcVar2 = (strName->_M_dataplus)._M_p;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + strName->_M_string_length);
  std::optional<std::__cxx11::string>::operator=
            ((optional<std::__cxx11::string> *)this_00,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  iVar6 = IsMine(this,address);
  if ((new_purpose->super__Optional_base<wallet::AddressPurpose,_true,_true>)._M_payload.
      super__Optional_payload_base<wallet::AddressPurpose>._M_engaged == true) {
    (this_00->purpose).super__Optional_base<wallet::AddressPurpose,_true,_true>._M_payload.
    super__Optional_payload_base<wallet::AddressPurpose> =
         (new_purpose->super__Optional_base<wallet::AddressPurpose,_true,_true>)._M_payload.
         super__Optional_payload_base<wallet::AddressPurpose>;
  }
  _Var3 = (this_00->purpose).super__Optional_base<wallet::AddressPurpose,_true,_true>._M_payload.
          super__Optional_payload_base<wallet::AddressPurpose>;
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_78);
  EncodeDestination_abi_cxx11_((string *)local_78,address);
  bVar5 = (new_purpose->super__Optional_base<wallet::AddressPurpose,_true,_true>)._M_payload.
          super__Optional_payload_base<wallet::AddressPurpose>._M_engaged;
  if (bVar5 == true) {
    AVar1 = (new_purpose->super__Optional_base<wallet::AddressPurpose,_true,_true>)._M_payload.
            super__Optional_payload_base<wallet::AddressPurpose>._M_payload._M_value;
    if (AVar1 == REFUND) {
      local_98.field_2._M_allocated_capacity._0_4_ = 0x75666572;
      local_98.field_2._M_local_buf[4] = 'n';
      local_98.field_2._M_local_buf[5] = 'd';
      local_98._M_string_length = 6;
      local_98.field_2._M_local_buf[6] = '\0';
    }
    else if (AVar1 == SEND) {
      local_98.field_2._M_allocated_capacity._0_4_ = 0x646e6573;
      local_98._M_string_length = 4;
      local_98.field_2._M_local_buf[4] = '\0';
    }
    else {
      if (AVar1 != RECEIVE) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                      ,0x115,"std::string wallet::PurposeToString(AddressPurpose)");
      }
      local_98.field_2._M_allocated_capacity._0_4_ = 0x65636572;
      local_98.field_2._M_local_buf[4] = 'i';
      local_98.field_2._M_local_buf[5] = 'v';
      local_98.field_2._M_local_buf[6] = 'e';
      local_98._M_string_length = 7;
      local_98.field_2._M_local_buf[7] = '\0';
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    bVar4 = WalletBatch::WritePurpose(batch,(string *)local_78,&local_98);
    bVar4 = !bVar4;
  }
  else {
    bVar4 = false;
  }
  if ((bVar5 != false) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2)) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT17(local_98.field_2._M_local_buf[7],
                             CONCAT16(local_98.field_2._M_local_buf[6],
                                      CONCAT15(local_98.field_2._M_local_buf[5],
                                               CONCAT14(local_98.field_2._M_local_buf[4],
                                                        local_98.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  if (bVar4) {
    wallet_fmt = "Error: fail to write address book \'purpose\' entry\n";
  }
  else {
    bVar5 = WalletBatch::WriteName(batch,(string *)local_78,strName);
    if (bVar5) {
      args_3._M_value._1_3_ = 0;
      args_3._M_value._0_1_ = iVar6 == ISMINE_NO;
      if (((ulong)_Var3 >> 0x20 & 1) != 0) {
        args_3 = _Var3._M_payload;
      }
      bVar5 = true;
      boost::signals2::
      signal<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType)>,_boost::signals2::mutex>
      ::operator()(&this->NotifyAddressBookChanged,address,strName,iVar6 != ISMINE_NO,
                   args_3._M_value,local_bc);
      goto LAB_001631e3;
    }
    wallet_fmt = "Error: fail to write address book \'name\' entry\n";
  }
  WalletLogPrintf<>(this,(ConstevalFormatString<0U>)wallet_fmt);
  bVar5 = false;
LAB_001631e3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &local_68) {
    operator_delete((void *)local_78._0_8_,local_68._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool CWallet::SetAddressBookWithDB(WalletBatch& batch, const CTxDestination& address, const std::string& strName, const std::optional<AddressPurpose>& new_purpose)
{
    bool fUpdated = false;
    bool is_mine;
    std::optional<AddressPurpose> purpose;
    {
        LOCK(cs_wallet);
        std::map<CTxDestination, CAddressBookData>::iterator mi = m_address_book.find(address);
        fUpdated = mi != m_address_book.end() && !mi->second.IsChange();

        CAddressBookData& record = mi != m_address_book.end() ? mi->second : m_address_book[address];
        record.SetLabel(strName);
        is_mine = IsMine(address) != ISMINE_NO;
        if (new_purpose) { /* update purpose only if requested */
            record.purpose = new_purpose;
        }
        purpose = record.purpose;
    }

    const std::string& encoded_dest = EncodeDestination(address);
    if (new_purpose && !batch.WritePurpose(encoded_dest, PurposeToString(*new_purpose))) {
        WalletLogPrintf("Error: fail to write address book 'purpose' entry\n");
        return false;
    }
    if (!batch.WriteName(encoded_dest, strName)) {
        WalletLogPrintf("Error: fail to write address book 'name' entry\n");
        return false;
    }

    // In very old wallets, address purpose may not be recorded so we derive it from IsMine
    NotifyAddressBookChanged(address, strName, is_mine,
                             purpose.value_or(is_mine ? AddressPurpose::RECEIVE : AddressPurpose::SEND),
                             (fUpdated ? CT_UPDATED : CT_NEW));
    return true;
}